

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int ConnectRPLIDAR(RPLIDAR *pRPLIDAR,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char *local_458;
  BOOL local_42c;
  char local_428 [4];
  BOOL bProtectionStop;
  char line [1024];
  FILE *file;
  char *szCfgFilePath_local;
  RPLIDAR *pRPLIDAR_local;
  
  line[0x3f8] = '\0';
  line[0x3f9] = '\0';
  line[0x3fa] = '\0';
  line[0x3fb] = '\0';
  line[0x3fc] = '\0';
  line[0x3fd] = '\0';
  line[0x3fe] = '\0';
  line[0x3ff] = '\0';
  local_42c = 0;
  memset(pRPLIDAR->szCfgFilePath,0,0x100);
  sprintf(pRPLIDAR->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_428,0,0x400);
    memset(pRPLIDAR->szDevPath,0,0x100);
    sprintf(pRPLIDAR->szDevPath,"COM1");
    pRPLIDAR->BaudRate = 0x1c200;
    pRPLIDAR->timeout = 1000;
    pRPLIDAR->threadperiod = 0x32;
    pRPLIDAR->bSaveRawData = 1;
    pRPLIDAR->bStartScanModeAtStartup = 1;
    pRPLIDAR->ScanMode = 0;
    pRPLIDAR->motordelay = 500;
    pRPLIDAR->motorPWM = 0x294;
    pRPLIDAR->maxhist = 0x400;
    pRPLIDAR->alpha_max_err = 0.01;
    pRPLIDAR->d_max_err = 0.1;
    line._1016_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._1016_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%255s",pRPLIDAR->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->bStartScanModeAtStartup);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->ScanMode);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->motordelay);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->motorPWM);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%d",&pRPLIDAR->maxhist);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%lf",&pRPLIDAR->alpha_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._1016_8_,local_428,0x400);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_428,"%lf",&pRPLIDAR->d_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._1016_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pRPLIDAR->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pRPLIDAR->threadperiod = 0x32;
  }
  if (pRPLIDAR->ScanMode < 0) {
    printf("Invalid parameter : ScanMode.\n");
    pRPLIDAR->ScanMode = 0;
  }
  if (pRPLIDAR->motordelay < 0) {
    printf("Invalid parameter : motordelay.\n");
    pRPLIDAR->motordelay = 500;
  }
  if ((pRPLIDAR->maxhist < 0) || (0x2000 < pRPLIDAR->maxhist)) {
    printf("Invalid parameter : maxhist.\n");
    pRPLIDAR->maxhist = 0x400;
  }
  iVar1 = OpenRS232Port(&pRPLIDAR->RS232Port,pRPLIDAR->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pRPLIDAR->RS232Port,pRPLIDAR->BaudRate,'\0',0,'\b','\0',
                                pRPLIDAR->timeout);
    if (iVar1 == 0) {
      memset(pRPLIDAR->SerialNumber,0,0x21);
      if (pRPLIDAR->bStartScanModeAtStartup != 0) {
        GetStartupMessageRPLIDAR(pRPLIDAR);
        iVar1 = StopRequestRPLIDAR(pRPLIDAR);
        if (iVar1 != 0) {
          printf("Warning : RPLIDAR STOP failure.\n");
        }
        iVar1 = GetInfoRequestRPLIDAR
                          (pRPLIDAR,&pRPLIDAR->model,&pRPLIDAR->hardware,&pRPLIDAR->firmware_major,
                           &pRPLIDAR->firmware_minor,pRPLIDAR->SerialNumber);
        if (iVar1 != 0) {
          printf("Warning : RPLIDAR GET_INFO failure.\n");
        }
        iVar1 = GetHealthRequestRPLIDAR(pRPLIDAR,&local_42c);
        if (iVar1 != 0) {
          printf("Warning : RPLIDAR GET_HEALTH failure.\n");
        }
        if (local_42c != 0) {
          iVar1 = ResetRequestRPLIDAR(pRPLIDAR);
          if (iVar1 != 0) {
            printf("Unable to connect to a RPLIDAR : RESET failure.\n");
            CloseRS232Port(&pRPLIDAR->RS232Port);
            return 1;
          }
          GetStartupMessageRPLIDAR(pRPLIDAR);
          StopRequestRPLIDAR(pRPLIDAR);
        }
        SetMotorPWMRequestRPLIDAR(pRPLIDAR,pRPLIDAR->motorPWM);
        pRPLIDAR->esdata_prev[0x40] = '\0';
        pRPLIDAR->esdata_prev[0x41] = '\0';
        pRPLIDAR->esdata_prev[0x42] = '\0';
        pRPLIDAR->esdata_prev[0x43] = '\0';
        pRPLIDAR->esdata_prev[0x44] = '\0';
        pRPLIDAR->esdata_prev[0x45] = '\0';
        pRPLIDAR->esdata_prev[0x46] = '\0';
        pRPLIDAR->esdata_prev[0x47] = '\0';
        pRPLIDAR->esdata_prev[0x48] = '\0';
        pRPLIDAR->esdata_prev[0x49] = '\0';
        pRPLIDAR->esdata_prev[0x4a] = '\0';
        pRPLIDAR->esdata_prev[0x4b] = '\0';
        pRPLIDAR->esdata_prev[0x4c] = '\0';
        pRPLIDAR->esdata_prev[0x4d] = '\0';
        pRPLIDAR->esdata_prev[0x4e] = '\0';
        pRPLIDAR->esdata_prev[0x4f] = '\0';
        pRPLIDAR->esdata_prev[0x30] = '\0';
        pRPLIDAR->esdata_prev[0x31] = '\0';
        pRPLIDAR->esdata_prev[0x32] = '\0';
        pRPLIDAR->esdata_prev[0x33] = '\0';
        pRPLIDAR->esdata_prev[0x34] = '\0';
        pRPLIDAR->esdata_prev[0x35] = '\0';
        pRPLIDAR->esdata_prev[0x36] = '\0';
        pRPLIDAR->esdata_prev[0x37] = '\0';
        pRPLIDAR->esdata_prev[0x38] = '\0';
        pRPLIDAR->esdata_prev[0x39] = '\0';
        pRPLIDAR->esdata_prev[0x3a] = '\0';
        pRPLIDAR->esdata_prev[0x3b] = '\0';
        pRPLIDAR->esdata_prev[0x3c] = '\0';
        pRPLIDAR->esdata_prev[0x3d] = '\0';
        pRPLIDAR->esdata_prev[0x3e] = '\0';
        pRPLIDAR->esdata_prev[0x3f] = '\0';
        pRPLIDAR->esdata_prev[0x20] = '\0';
        pRPLIDAR->esdata_prev[0x21] = '\0';
        pRPLIDAR->esdata_prev[0x22] = '\0';
        pRPLIDAR->esdata_prev[0x23] = '\0';
        pRPLIDAR->esdata_prev[0x24] = '\0';
        pRPLIDAR->esdata_prev[0x25] = '\0';
        pRPLIDAR->esdata_prev[0x26] = '\0';
        pRPLIDAR->esdata_prev[0x27] = '\0';
        pRPLIDAR->esdata_prev[0x28] = '\0';
        pRPLIDAR->esdata_prev[0x29] = '\0';
        pRPLIDAR->esdata_prev[0x2a] = '\0';
        pRPLIDAR->esdata_prev[0x2b] = '\0';
        pRPLIDAR->esdata_prev[0x2c] = '\0';
        pRPLIDAR->esdata_prev[0x2d] = '\0';
        pRPLIDAR->esdata_prev[0x2e] = '\0';
        pRPLIDAR->esdata_prev[0x2f] = '\0';
        pRPLIDAR->esdata_prev[0x10] = '\0';
        pRPLIDAR->esdata_prev[0x11] = '\0';
        pRPLIDAR->esdata_prev[0x12] = '\0';
        pRPLIDAR->esdata_prev[0x13] = '\0';
        pRPLIDAR->esdata_prev[0x14] = '\0';
        pRPLIDAR->esdata_prev[0x15] = '\0';
        pRPLIDAR->esdata_prev[0x16] = '\0';
        pRPLIDAR->esdata_prev[0x17] = '\0';
        pRPLIDAR->esdata_prev[0x18] = '\0';
        pRPLIDAR->esdata_prev[0x19] = '\0';
        pRPLIDAR->esdata_prev[0x1a] = '\0';
        pRPLIDAR->esdata_prev[0x1b] = '\0';
        pRPLIDAR->esdata_prev[0x1c] = '\0';
        pRPLIDAR->esdata_prev[0x1d] = '\0';
        pRPLIDAR->esdata_prev[0x1e] = '\0';
        pRPLIDAR->esdata_prev[0x1f] = '\0';
        pRPLIDAR->esdata_prev[0] = '\0';
        pRPLIDAR->esdata_prev[1] = '\0';
        pRPLIDAR->esdata_prev[2] = '\0';
        pRPLIDAR->esdata_prev[3] = '\0';
        pRPLIDAR->esdata_prev[4] = '\0';
        pRPLIDAR->esdata_prev[5] = '\0';
        pRPLIDAR->esdata_prev[6] = '\0';
        pRPLIDAR->esdata_prev[7] = '\0';
        pRPLIDAR->esdata_prev[8] = '\0';
        pRPLIDAR->esdata_prev[9] = '\0';
        pRPLIDAR->esdata_prev[10] = '\0';
        pRPLIDAR->esdata_prev[0xb] = '\0';
        pRPLIDAR->esdata_prev[0xc] = '\0';
        pRPLIDAR->esdata_prev[0xd] = '\0';
        pRPLIDAR->esdata_prev[0xe] = '\0';
        pRPLIDAR->esdata_prev[0xf] = '\0';
        pRPLIDAR->esdata_prev[0x50] = '\0';
        pRPLIDAR->esdata_prev[0x51] = '\0';
        pRPLIDAR->esdata_prev[0x52] = '\0';
        pRPLIDAR->esdata_prev[0x53] = '\0';
        pRPLIDAR->eesdata_prev[0x70] = '\0';
        pRPLIDAR->eesdata_prev[0x71] = '\0';
        pRPLIDAR->eesdata_prev[0x72] = '\0';
        pRPLIDAR->eesdata_prev[0x73] = '\0';
        pRPLIDAR->eesdata_prev[0x74] = '\0';
        pRPLIDAR->eesdata_prev[0x75] = '\0';
        pRPLIDAR->eesdata_prev[0x76] = '\0';
        pRPLIDAR->eesdata_prev[0x77] = '\0';
        pRPLIDAR->eesdata_prev[0x78] = '\0';
        pRPLIDAR->eesdata_prev[0x79] = '\0';
        pRPLIDAR->eesdata_prev[0x7a] = '\0';
        pRPLIDAR->eesdata_prev[0x7b] = '\0';
        pRPLIDAR->eesdata_prev[0x7c] = '\0';
        pRPLIDAR->eesdata_prev[0x7d] = '\0';
        pRPLIDAR->eesdata_prev[0x7e] = '\0';
        pRPLIDAR->eesdata_prev[0x7f] = '\0';
        pRPLIDAR->eesdata_prev[0x60] = '\0';
        pRPLIDAR->eesdata_prev[0x61] = '\0';
        pRPLIDAR->eesdata_prev[0x62] = '\0';
        pRPLIDAR->eesdata_prev[99] = '\0';
        pRPLIDAR->eesdata_prev[100] = '\0';
        pRPLIDAR->eesdata_prev[0x65] = '\0';
        pRPLIDAR->eesdata_prev[0x66] = '\0';
        pRPLIDAR->eesdata_prev[0x67] = '\0';
        pRPLIDAR->eesdata_prev[0x68] = '\0';
        pRPLIDAR->eesdata_prev[0x69] = '\0';
        pRPLIDAR->eesdata_prev[0x6a] = '\0';
        pRPLIDAR->eesdata_prev[0x6b] = '\0';
        pRPLIDAR->eesdata_prev[0x6c] = '\0';
        pRPLIDAR->eesdata_prev[0x6d] = '\0';
        pRPLIDAR->eesdata_prev[0x6e] = '\0';
        pRPLIDAR->eesdata_prev[0x6f] = '\0';
        pRPLIDAR->eesdata_prev[0x50] = '\0';
        pRPLIDAR->eesdata_prev[0x51] = '\0';
        pRPLIDAR->eesdata_prev[0x52] = '\0';
        pRPLIDAR->eesdata_prev[0x53] = '\0';
        pRPLIDAR->eesdata_prev[0x54] = '\0';
        pRPLIDAR->eesdata_prev[0x55] = '\0';
        pRPLIDAR->eesdata_prev[0x56] = '\0';
        pRPLIDAR->eesdata_prev[0x57] = '\0';
        pRPLIDAR->eesdata_prev[0x58] = '\0';
        pRPLIDAR->eesdata_prev[0x59] = '\0';
        pRPLIDAR->eesdata_prev[0x5a] = '\0';
        pRPLIDAR->eesdata_prev[0x5b] = '\0';
        pRPLIDAR->eesdata_prev[0x5c] = '\0';
        pRPLIDAR->eesdata_prev[0x5d] = '\0';
        pRPLIDAR->eesdata_prev[0x5e] = '\0';
        pRPLIDAR->eesdata_prev[0x5f] = '\0';
        pRPLIDAR->eesdata_prev[0x40] = '\0';
        pRPLIDAR->eesdata_prev[0x41] = '\0';
        pRPLIDAR->eesdata_prev[0x42] = '\0';
        pRPLIDAR->eesdata_prev[0x43] = '\0';
        pRPLIDAR->eesdata_prev[0x44] = '\0';
        pRPLIDAR->eesdata_prev[0x45] = '\0';
        pRPLIDAR->eesdata_prev[0x46] = '\0';
        pRPLIDAR->eesdata_prev[0x47] = '\0';
        pRPLIDAR->eesdata_prev[0x48] = '\0';
        pRPLIDAR->eesdata_prev[0x49] = '\0';
        pRPLIDAR->eesdata_prev[0x4a] = '\0';
        pRPLIDAR->eesdata_prev[0x4b] = '\0';
        pRPLIDAR->eesdata_prev[0x4c] = '\0';
        pRPLIDAR->eesdata_prev[0x4d] = '\0';
        pRPLIDAR->eesdata_prev[0x4e] = '\0';
        pRPLIDAR->eesdata_prev[0x4f] = '\0';
        pRPLIDAR->eesdata_prev[0x30] = '\0';
        pRPLIDAR->eesdata_prev[0x31] = '\0';
        pRPLIDAR->eesdata_prev[0x32] = '\0';
        pRPLIDAR->eesdata_prev[0x33] = '\0';
        pRPLIDAR->eesdata_prev[0x34] = '\0';
        pRPLIDAR->eesdata_prev[0x35] = '\0';
        pRPLIDAR->eesdata_prev[0x36] = '\0';
        pRPLIDAR->eesdata_prev[0x37] = '\0';
        pRPLIDAR->eesdata_prev[0x38] = '\0';
        pRPLIDAR->eesdata_prev[0x39] = '\0';
        pRPLIDAR->eesdata_prev[0x3a] = '\0';
        pRPLIDAR->eesdata_prev[0x3b] = '\0';
        pRPLIDAR->eesdata_prev[0x3c] = '\0';
        pRPLIDAR->eesdata_prev[0x3d] = '\0';
        pRPLIDAR->eesdata_prev[0x3e] = '\0';
        pRPLIDAR->eesdata_prev[0x3f] = '\0';
        pRPLIDAR->eesdata_prev[0x20] = '\0';
        pRPLIDAR->eesdata_prev[0x21] = '\0';
        pRPLIDAR->eesdata_prev[0x22] = '\0';
        pRPLIDAR->eesdata_prev[0x23] = '\0';
        pRPLIDAR->eesdata_prev[0x24] = '\0';
        pRPLIDAR->eesdata_prev[0x25] = '\0';
        pRPLIDAR->eesdata_prev[0x26] = '\0';
        pRPLIDAR->eesdata_prev[0x27] = '\0';
        pRPLIDAR->eesdata_prev[0x28] = '\0';
        pRPLIDAR->eesdata_prev[0x29] = '\0';
        pRPLIDAR->eesdata_prev[0x2a] = '\0';
        pRPLIDAR->eesdata_prev[0x2b] = '\0';
        pRPLIDAR->eesdata_prev[0x2c] = '\0';
        pRPLIDAR->eesdata_prev[0x2d] = '\0';
        pRPLIDAR->eesdata_prev[0x2e] = '\0';
        pRPLIDAR->eesdata_prev[0x2f] = '\0';
        pRPLIDAR->eesdata_prev[0x10] = '\0';
        pRPLIDAR->eesdata_prev[0x11] = '\0';
        pRPLIDAR->eesdata_prev[0x12] = '\0';
        pRPLIDAR->eesdata_prev[0x13] = '\0';
        pRPLIDAR->eesdata_prev[0x14] = '\0';
        pRPLIDAR->eesdata_prev[0x15] = '\0';
        pRPLIDAR->eesdata_prev[0x16] = '\0';
        pRPLIDAR->eesdata_prev[0x17] = '\0';
        pRPLIDAR->eesdata_prev[0x18] = '\0';
        pRPLIDAR->eesdata_prev[0x19] = '\0';
        pRPLIDAR->eesdata_prev[0x1a] = '\0';
        pRPLIDAR->eesdata_prev[0x1b] = '\0';
        pRPLIDAR->eesdata_prev[0x1c] = '\0';
        pRPLIDAR->eesdata_prev[0x1d] = '\0';
        pRPLIDAR->eesdata_prev[0x1e] = '\0';
        pRPLIDAR->eesdata_prev[0x1f] = '\0';
        pRPLIDAR->eesdata_prev[0] = '\0';
        pRPLIDAR->eesdata_prev[1] = '\0';
        pRPLIDAR->eesdata_prev[2] = '\0';
        pRPLIDAR->eesdata_prev[3] = '\0';
        pRPLIDAR->eesdata_prev[4] = '\0';
        pRPLIDAR->eesdata_prev[5] = '\0';
        pRPLIDAR->eesdata_prev[6] = '\0';
        pRPLIDAR->eesdata_prev[7] = '\0';
        pRPLIDAR->eesdata_prev[8] = '\0';
        pRPLIDAR->eesdata_prev[9] = '\0';
        pRPLIDAR->eesdata_prev[10] = '\0';
        pRPLIDAR->eesdata_prev[0xb] = '\0';
        pRPLIDAR->eesdata_prev[0xc] = '\0';
        pRPLIDAR->eesdata_prev[0xd] = '\0';
        pRPLIDAR->eesdata_prev[0xe] = '\0';
        pRPLIDAR->eesdata_prev[0xf] = '\0';
        pRPLIDAR->eesdata_prev[0x80] = '\0';
        pRPLIDAR->eesdata_prev[0x81] = '\0';
        pRPLIDAR->eesdata_prev[0x82] = '\0';
        pRPLIDAR->eesdata_prev[0x83] = '\0';
        pRPLIDAR->desdata_prev[0x40] = '\0';
        pRPLIDAR->desdata_prev[0x41] = '\0';
        pRPLIDAR->desdata_prev[0x42] = '\0';
        pRPLIDAR->desdata_prev[0x43] = '\0';
        pRPLIDAR->desdata_prev[0x44] = '\0';
        pRPLIDAR->desdata_prev[0x45] = '\0';
        pRPLIDAR->desdata_prev[0x46] = '\0';
        pRPLIDAR->desdata_prev[0x47] = '\0';
        pRPLIDAR->desdata_prev[0x48] = '\0';
        pRPLIDAR->desdata_prev[0x49] = '\0';
        pRPLIDAR->desdata_prev[0x4a] = '\0';
        pRPLIDAR->desdata_prev[0x4b] = '\0';
        pRPLIDAR->desdata_prev[0x4c] = '\0';
        pRPLIDAR->desdata_prev[0x4d] = '\0';
        pRPLIDAR->desdata_prev[0x4e] = '\0';
        pRPLIDAR->desdata_prev[0x4f] = '\0';
        pRPLIDAR->desdata_prev[0x30] = '\0';
        pRPLIDAR->desdata_prev[0x31] = '\0';
        pRPLIDAR->desdata_prev[0x32] = '\0';
        pRPLIDAR->desdata_prev[0x33] = '\0';
        pRPLIDAR->desdata_prev[0x34] = '\0';
        pRPLIDAR->desdata_prev[0x35] = '\0';
        pRPLIDAR->desdata_prev[0x36] = '\0';
        pRPLIDAR->desdata_prev[0x37] = '\0';
        pRPLIDAR->desdata_prev[0x38] = '\0';
        pRPLIDAR->desdata_prev[0x39] = '\0';
        pRPLIDAR->desdata_prev[0x3a] = '\0';
        pRPLIDAR->desdata_prev[0x3b] = '\0';
        pRPLIDAR->desdata_prev[0x3c] = '\0';
        pRPLIDAR->desdata_prev[0x3d] = '\0';
        pRPLIDAR->desdata_prev[0x3e] = '\0';
        pRPLIDAR->desdata_prev[0x3f] = '\0';
        pRPLIDAR->desdata_prev[0x20] = '\0';
        pRPLIDAR->desdata_prev[0x21] = '\0';
        pRPLIDAR->desdata_prev[0x22] = '\0';
        pRPLIDAR->desdata_prev[0x23] = '\0';
        pRPLIDAR->desdata_prev[0x24] = '\0';
        pRPLIDAR->desdata_prev[0x25] = '\0';
        pRPLIDAR->desdata_prev[0x26] = '\0';
        pRPLIDAR->desdata_prev[0x27] = '\0';
        pRPLIDAR->desdata_prev[0x28] = '\0';
        pRPLIDAR->desdata_prev[0x29] = '\0';
        pRPLIDAR->desdata_prev[0x2a] = '\0';
        pRPLIDAR->desdata_prev[0x2b] = '\0';
        pRPLIDAR->desdata_prev[0x2c] = '\0';
        pRPLIDAR->desdata_prev[0x2d] = '\0';
        pRPLIDAR->desdata_prev[0x2e] = '\0';
        pRPLIDAR->desdata_prev[0x2f] = '\0';
        pRPLIDAR->desdata_prev[0x10] = '\0';
        pRPLIDAR->desdata_prev[0x11] = '\0';
        pRPLIDAR->desdata_prev[0x12] = '\0';
        pRPLIDAR->desdata_prev[0x13] = '\0';
        pRPLIDAR->desdata_prev[0x14] = '\0';
        pRPLIDAR->desdata_prev[0x15] = '\0';
        pRPLIDAR->desdata_prev[0x16] = '\0';
        pRPLIDAR->desdata_prev[0x17] = '\0';
        pRPLIDAR->desdata_prev[0x18] = '\0';
        pRPLIDAR->desdata_prev[0x19] = '\0';
        pRPLIDAR->desdata_prev[0x1a] = '\0';
        pRPLIDAR->desdata_prev[0x1b] = '\0';
        pRPLIDAR->desdata_prev[0x1c] = '\0';
        pRPLIDAR->desdata_prev[0x1d] = '\0';
        pRPLIDAR->desdata_prev[0x1e] = '\0';
        pRPLIDAR->desdata_prev[0x1f] = '\0';
        pRPLIDAR->desdata_prev[0] = '\0';
        pRPLIDAR->desdata_prev[1] = '\0';
        pRPLIDAR->desdata_prev[2] = '\0';
        pRPLIDAR->desdata_prev[3] = '\0';
        pRPLIDAR->desdata_prev[4] = '\0';
        pRPLIDAR->desdata_prev[5] = '\0';
        pRPLIDAR->desdata_prev[6] = '\0';
        pRPLIDAR->desdata_prev[7] = '\0';
        pRPLIDAR->desdata_prev[8] = '\0';
        pRPLIDAR->desdata_prev[9] = '\0';
        pRPLIDAR->desdata_prev[10] = '\0';
        pRPLIDAR->desdata_prev[0xb] = '\0';
        pRPLIDAR->desdata_prev[0xc] = '\0';
        pRPLIDAR->desdata_prev[0xd] = '\0';
        pRPLIDAR->desdata_prev[0xe] = '\0';
        pRPLIDAR->desdata_prev[0xf] = '\0';
        pRPLIDAR->desdata_prev[0x50] = '\0';
        pRPLIDAR->desdata_prev[0x51] = '\0';
        pRPLIDAR->desdata_prev[0x52] = '\0';
        pRPLIDAR->desdata_prev[0x53] = '\0';
        iVar1 = pRPLIDAR->ScanMode;
        if (iVar1 == 0) {
          iVar1 = StartScanRequestRPLIDAR(pRPLIDAR);
          if (iVar1 != 0) {
            printf("Unable to connect to a RPLIDAR : SCAN failure.\n");
            SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
            CloseRS232Port(&pRPLIDAR->RS232Port);
            return 1;
          }
        }
        else if (iVar1 == 0xfe) {
          iVar1 = StartExpressScanRequestRPLIDAR(pRPLIDAR);
          if (iVar1 != 0) {
            printf("Unable to connect to a RPLIDAR : EXPRESS_SCAN failure.\n");
            SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
            CloseRS232Port(&pRPLIDAR->RS232Port);
            return 1;
          }
        }
        else if (iVar1 == 0xff) {
          iVar1 = StartForceScanRequestRPLIDAR(pRPLIDAR);
          if (iVar1 != 0) {
            printf("Unable to connect to a RPLIDAR : FORCE_SCAN failure.\n");
            SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
            CloseRS232Port(&pRPLIDAR->RS232Port);
            return 1;
          }
        }
        else {
          iVar1 = StartOtherScanRequestRPLIDAR(pRPLIDAR,pRPLIDAR->ScanMode);
          if (iVar1 != 0) {
            printf("Unable to connect to a RPLIDAR : scan mode failure.\n");
            SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
            CloseRS232Port(&pRPLIDAR->RS232Port);
            return 1;
          }
        }
        mSleep((long)pRPLIDAR->motordelay);
      }
      if (pRPLIDAR->SerialNumber[0] == '\0') {
        local_458 = "";
      }
      else {
        local_458 = " ";
      }
      printf("RPLIDAR %.32s%.1sconnected.\n",pRPLIDAR->SerialNumber,local_458);
      pRPLIDAR_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a RPLIDAR.\n");
      CloseRS232Port(&pRPLIDAR->RS232Port);
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a RPLIDAR.\n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int ConnectRPLIDAR(RPLIDAR* pRPLIDAR, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[1024];
	BOOL bProtectionStop = FALSE;

	memset(pRPLIDAR->szCfgFilePath, 0, sizeof(pRPLIDAR->szCfgFilePath));
	sprintf(pRPLIDAR->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRPLIDAR->szDevPath, 0, sizeof(pRPLIDAR->szDevPath));
		sprintf(pRPLIDAR->szDevPath, "COM1");
		pRPLIDAR->BaudRate = 115200;
		pRPLIDAR->timeout = 1000;
		pRPLIDAR->threadperiod = 50;
		pRPLIDAR->bSaveRawData = 1;
		pRPLIDAR->bStartScanModeAtStartup = 1;
		pRPLIDAR->ScanMode = SCAN_MODE_RPLIDAR;
		pRPLIDAR->motordelay = 500;
		pRPLIDAR->motorPWM = DEFAULT_MOTOR_PWM_RPLIDAR;
		pRPLIDAR->maxhist = 1024;
		pRPLIDAR->alpha_max_err = 0.01;
		pRPLIDAR->d_max_err = 0.1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRPLIDAR->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->bStartScanModeAtStartup) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->ScanMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->motordelay) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->motorPWM) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->maxhist) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRPLIDAR->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRPLIDAR->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRPLIDAR->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRPLIDAR->threadperiod = 50;
	}
	if (pRPLIDAR->ScanMode < 0)
	{
		printf("Invalid parameter : ScanMode.\n");
		pRPLIDAR->ScanMode = SCAN_MODE_RPLIDAR;
	}
	if (pRPLIDAR->motordelay < 0)
	{
		printf("Invalid parameter : motordelay.\n");
		pRPLIDAR->motordelay = 500;
	}
	if ((pRPLIDAR->maxhist < 0)||(pRPLIDAR->maxhist > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
	{
		printf("Invalid parameter : maxhist.\n");
		pRPLIDAR->maxhist = 1024;
	}

	// Used to save raw data, should be handled specifically...
	//pRPLIDAR->pfSaveFile = NULL;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	_u32 drvtype = CHANNEL_TYPE_SERIALPORT;
#else
	int drvtype = CHANNEL_TYPE_SERIALPORT;
#endif // FORCE_RPLIDAR_SDK_V1
	char address[256];
	char port[256];
	int iport = 0, ilport = 0;
	char* ptr = NULL;
	char* ptr2 = NULL;

	memset(address, 0, sizeof(address));
	memset(port, 0, sizeof(port));

	// Try to determine whether it is a server TCP port (e.g. :4001), client IP address and TCP port (e.g. 127.0.0.1:4001), 
	// IP address and UDP ports (e.g. udp://127.0.0.1:4001:4002) or local RS232 port.
	ptr = strchr(pRPLIDAR->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pRPLIDAR->szDevPath) >= 12)&&(strncmp(pRPLIDAR->szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+9, ptr2-(pRPLIDAR->szDevPath+9));
		strcpy(port, ptr2+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 9)&&(strncmp(pRPLIDAR->szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+6, ptr2-(pRPLIDAR->szDevPath+6));
		strcpy(port, ptr2+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 9)&&(strncmp(pRPLIDAR->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+6, ptr2-(pRPLIDAR->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
#ifdef FORCE_RPLIDAR_SDK_V1
		printf("Unable to connect to a RPLIDAR : Not implemented.\n");
		return EXIT_NOT_IMPLEMENTED;
#else
		drvtype = CHANNEL_TYPE_UDP;
#endif // FORCE_RPLIDAR_SDK_V1
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 5)&&(strncmp(pRPLIDAR->szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(pRPLIDAR->szDevPath+4) > 0))
	{
		strcpy(address, "0.0.0.0");
		strcpy(port, pRPLIDAR->szDevPath+4);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((pRPLIDAR->szDevPath[0] == ':')&&(atoi(pRPLIDAR->szDevPath+1) > 0))
	{
		strcpy(address, "0.0.0.0");
		strcpy(port, pRPLIDAR->szDevPath+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((ptr != NULL)&&(ptr[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath, ptr-pRPLIDAR->szDevPath);
		strcpy(port, ptr+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else
	{
		strcpy(address, pRPLIDAR->szDevPath);
		sprintf(port, "%d", pRPLIDAR->BaudRate);
		drvtype = CHANNEL_TYPE_SERIALPORT;
	}

#ifdef FORCE_RPLIDAR_SDK_V1
	pRPLIDAR->drv = RPlidarDriver::CreateDriver(drvtype);
#else
	pRPLIDAR->drv = *createLidarDriver();
#endif // FORCE_RPLIDAR_SDK_V1
	if (!pRPLIDAR->drv)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		return EXIT_FAILURE;
	}
	
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->connect(address, atoi(port))))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (IS_FAIL(pRPLIDAR->drv->startMotor()))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}
#else
	if (drvtype == CHANNEL_TYPE_SERIALPORT)
	{
		pRPLIDAR->channel = *createSerialPortChannel(address, atoi(port));
	}
	else if (drvtype == CHANNEL_TYPE_TCP)
	{
		pRPLIDAR->channel = *createTcpChannel(address, atoi(port));
	}
	else if (drvtype == CHANNEL_TYPE_UDP)
	{
		pRPLIDAR->channel = *createUdpChannel(address, atoi(port));
	}
	else
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (!pRPLIDAR->channel)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (SL_IS_FAIL(pRPLIDAR->drv->connect(pRPLIDAR->channel)))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	// startMotor() probably only necessary for old versions of the SDK...
	// startMotor() equivalent from https://github.com/Slamtec/sllidar_ros2/blob/main/src/sllidar_node.cpp...
	//if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed()))
	//{
	//	printf("Unable to connect to a RPLIDAR : setMotorSpeed() failed. \n");
	//	return EXIT_FAILURE;
	//}
	//if (SL_IS_FAIL(pRPLIDAR->drv->startScan(0,1)))
	//{
	//	printf("Unable to connect to a RPLIDAR : startScan() failed. \n");
	//	return EXIT_FAILURE;
	//}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	if (OpenRS232Port(&pRPLIDAR->RS232Port, pRPLIDAR->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRPLIDAR->RS232Port, pRPLIDAR->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pRPLIDAR->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		CloseRS232Port(&pRPLIDAR->RS232Port);
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	pRPLIDAR->nodes_cache = new std::deque<sl_lidar_response_measurement_node_hq_t>();
	if (!pRPLIDAR->nodes_cache)
	{
		printf("Unable to connect to a RPLIDAR : Out of memory. .\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
		pRPLIDAR->drv->stopMotor();
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		pRPLIDAR->drv->disconnect();
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		return EXIT_OUT_OF_MEMORY;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	memset(pRPLIDAR->SerialNumber, 0, sizeof(pRPLIDAR->SerialNumber));

	if (pRPLIDAR->bStartScanModeAtStartup)
	{
		GetStartupMessageRPLIDAR(pRPLIDAR);

		// Stop any currently running scan.
		if (StopRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR STOP failure.\n");
		}

		if (GetInfoRequestRPLIDAR(pRPLIDAR, &pRPLIDAR->model, &pRPLIDAR->hardware, &pRPLIDAR->firmware_major, &pRPLIDAR->firmware_minor, pRPLIDAR->SerialNumber) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR GET_INFO failure.\n");
		}

		if (GetHealthRequestRPLIDAR(pRPLIDAR, &bProtectionStop) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR GET_HEALTH failure.\n");
		}

		if (bProtectionStop)
		{
			if (ResetRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : RESET failure.\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			GetStartupMessageRPLIDAR(pRPLIDAR);
			StopRequestRPLIDAR(pRPLIDAR);
		}

		// Incompatible with old RPLIDAR...
		//if (GetSampleRateRequestRPLIDAR(pRPLIDAR, &pRPLIDAR->Tstandard, &pRPLIDAR->Texpress) != EXIT_SUCCESS)
		//{
		//	printf("Unable to connect to a RPLIDAR : GET_SAMPLERATE failure.\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
		//	delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
		//	pRPLIDAR->drv->stopMotor();
		//	pRPLIDAR->drv->disconnect();
		//	RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//	//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		//	pRPLIDAR->drv->disconnect();
		//	delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		//	delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		//	CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		//	return EXIT_FAILURE;
		//}

		SetMotorPWMRequestRPLIDAR(pRPLIDAR, pRPLIDAR->motorPWM);

		memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
		memset(pRPLIDAR->eesdata_prev, 0, sizeof(pRPLIDAR->eesdata_prev));
		memset(pRPLIDAR->desdata_prev, 0, sizeof(pRPLIDAR->desdata_prev));
		switch (pRPLIDAR->ScanMode)
		{
		case SCAN_MODE_RPLIDAR:
			if (StartScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		case LEGACY_EXPRESS_SCAN_MODE_RPLIDAR:
			if (StartExpressScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : EXPRESS_SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		// Force scan is a special case...
		case FORCE_SCAN_MODE_RPLIDAR:
			if (StartForceScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : FORCE_SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		default:
			if (StartOtherScanRequestRPLIDAR(pRPLIDAR, pRPLIDAR->ScanMode) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : scan mode failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		}

		// Wait for the motor rotation to become stable.
		mSleep(pRPLIDAR->motordelay);
	}

	printf("RPLIDAR %.32s%.1sconnected.\n", pRPLIDAR->SerialNumber, (pRPLIDAR->SerialNumber[0])? " ": "\0");

	return EXIT_SUCCESS;
}